

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O1

void sysbvm_integer_registerPrimitives(void)

{
  sysbvm_primitiveTable_registerFunction
            (sysbvm_integer_primitive_parseString,"Integer::parseString:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_integer_primitive_printString,"Integer::printString");
  sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_add,"Integer::+");
  sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_subtract,"Integer::-");
  sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_negated,"Integer::negated");
  sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_multiply,"Integer::*");
  sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_divide,"Integer::/");
  sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_remainder,"Integer::%");
  sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_compare,"Integer::<=>");
  sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_equals,"Integer::=");
  sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_notEquals,"Integer::~=");
  sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_lessThan,"Integer::<");
  sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_lessEquals,"Integer::<=");
  sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_greaterThan,"Integer::>");
  sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_greaterEquals,"Integer::>=");
  sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_factorial,"Integer::factorial");
  return;
}

Assistant:

void sysbvm_integer_registerPrimitives(void)
{
    sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_parseString, "Integer::parseString:");
    sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_printString, "Integer::printString");

    sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_add, "Integer::+");
    sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_subtract, "Integer::-");
    sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_negated, "Integer::negated");
    sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_multiply, "Integer::*");
    sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_divide, "Integer::/");
    sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_remainder, "Integer::%");

    sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_compare, "Integer::<=>");
    sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_equals, "Integer::=");
    sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_notEquals, "Integer::~=");
    sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_lessThan, "Integer::<");
    sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_lessEquals, "Integer::<=");
    sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_greaterThan, "Integer::>");
    sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_greaterEquals, "Integer::>=");

    sysbvm_primitiveTable_registerFunction(sysbvm_integer_primitive_factorial, "Integer::factorial");
}